

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::LastIndexOfHelper<Js::TypedArrayBase>
              (TypedArrayBase *pArr,Var search,int64 fromIndex,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  Var index;
  Var pvVar3;
  uint32 i;
  uint uVar4;
  uint index_00;
  ulong uVar5;
  Var local_40;
  char local_31;
  
  local_31 = TaggedInt::Is(search);
  pvVar3 = (Var)0x0;
  for (; 0xfffffffe < fromIndex; fromIndex = fromIndex - 1) {
    index = JavascriptNumber::ToVar(fromIndex,scriptContext);
    BVar2 = JavascriptOperators::OP_HasItem(pArr,index,scriptContext);
    if (BVar2 != 0) {
      pvVar3 = JavascriptOperators::OP_GetElementI(pArr,index,scriptContext);
      if ((local_31 == '\0') || (bVar1 = TaggedInt::Is(pvVar3), !bVar1)) {
        BVar2 = JavascriptOperators::StrictEqual(pvVar3,search,scriptContext);
        if (BVar2 != 0) {
          return index;
        }
      }
      else if (pvVar3 == search) {
        return index;
      }
    }
  }
  uVar4 = 0;
  uVar5 = fromIndex & 0xffffffff;
  local_40 = pvVar3;
  do {
    if ((uint)fromIndex < uVar4) {
      return &DAT_10000ffffffff;
    }
    index_00 = (uint)uVar5;
    BVar2 = TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
                      ((RecyclableObject *)pArr,index_00,&local_40,scriptContext,true);
    if (BVar2 != 0) {
      if ((local_31 == '\0') || (bVar1 = TaggedInt::Is(local_40), !bVar1)) {
        BVar2 = JavascriptOperators::StrictEqual(local_40,search,scriptContext);
        if (BVar2 != 0) goto LAB_00a59e6e;
      }
      else if (local_40 == search) {
LAB_00a59e6e:
        pvVar3 = JavascriptNumber::ToVar(index_00,scriptContext);
        return pvVar3;
      }
    }
    uVar4 = uVar4 + 1;
    uVar5 = (ulong)(index_00 - 1);
  } while( true );
}

Assistant:

Var JavascriptArray::LastIndexOfHelper(T* pArr, Var search, int64 fromIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);

        // First handle the indices > 2^32
        while (fromIndex >= MaxArrayLength)
        {
            Var index = JavascriptNumber::ToVar(fromIndex, scriptContext);

            if (JavascriptOperators::OP_HasItem(pArr, index, scriptContext))
            {
                element = JavascriptOperators::OP_GetElementI(pArr, index, scriptContext);

                if (isSearchTaggedInt && TaggedInt::Is(element))
                {
                    if (element == search)
                    {
                        return index;
                    }
                    fromIndex--;
                    continue;
                }

                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return index;
                }
            }

            fromIndex--;
        }

        Assert(fromIndex < MaxArrayLength);

        // fromIndex now has to be < MaxArrayLength so casting to uint32 is safe
        uint32 end = static_cast<uint32>(fromIndex);

        for (uint32 i = 0; i <= end; i++)
        {
            uint32 index = end - i;

            if (!TryTemplatedGetItem<T>(pArr, index, &element, scriptContext))
            {
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return JavascriptNumber::ToVar(index, scriptContext);
                }
                continue;
            }

            if (JavascriptOperators::StrictEqual(element, search, scriptContext))
            {
                return JavascriptNumber::ToVar(index, scriptContext);
            }
        }

        return TaggedInt::ToVarUnchecked(-1);
    }